

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

I32 laszip_prepare_header_for_write(laszip_dll_struct *laszip_dll)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  I32 IVar5;
  uint uVar6;
  long lVar7;
  
  bVar1 = (laszip_dll->header).version_major;
  if ((bVar1 == 1) && (bVar2 = (laszip_dll->header).version_minor, bVar2 < 5)) {
    if (5 < (laszip_dll->header).point_data_format) {
      (laszip_dll->header).number_of_point_records = 0;
      (laszip_dll->header).number_of_points_by_return[0] = 0;
      (laszip_dll->header).number_of_points_by_return[1] = 0;
      (laszip_dll->header).number_of_points_by_return[2] = 0;
      (laszip_dll->header).number_of_points_by_return[3] = 0;
      (laszip_dll->header).number_of_points_by_return[4] = 0;
      return 0;
    }
    IVar5 = 0;
    if (bVar2 != 4) {
      return 0;
    }
    uVar3 = (laszip_dll->header).number_of_point_records;
    uVar4 = (laszip_dll->header).extended_number_of_point_records;
    if (uVar4 != uVar3) {
      if (uVar3 != 0) {
        snprintf(laszip_dll->error,0x400,
                 "inconsistent number_of_point_records %lu and extended_number_of_point_records %llu"
                );
        goto LAB_001438ab;
      }
      if (uVar4 >> 0x20 == 0) {
        (laszip_dll->header).number_of_point_records = (laszip_U32)uVar4;
      }
    }
    lVar7 = 0x1b;
    do {
      uVar3 = *(uint *)((laszip_dll->header).project_ID_GUID_data_4 + lVar7 * 4 + -0xc);
      uVar4 = *(ulong *)((laszip_dll->header).generating_software + lVar7 * 8 + -0xe);
      if (uVar4 != uVar3) {
        if (uVar3 != 0) {
          uVar6 = (int)lVar7 - 0x1b;
          snprintf(laszip_dll->error,0x400,
                   "inconsistent number_of_points_by_return[%u] %lu and extended_number_of_points_by_return[%u] %llu"
                   ,(ulong)uVar6,(ulong)uVar3,(ulong)uVar6,uVar4);
          goto LAB_001438ab;
        }
        if (uVar4 >> 0x20 == 0) {
          *(int *)((laszip_dll->header).project_ID_GUID_data_4 + lVar7 * 4 + -0xc) = (int)uVar4;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
  }
  else {
    snprintf(laszip_dll->error,0x400,"unknown LAS version %d.%d",(ulong)bVar1,
             (ulong)(laszip_dll->header).version_minor);
LAB_001438ab:
    IVar5 = 1;
  }
  return IVar5;
}

Assistant:

static I32
laszip_prepare_header_for_write(
    laszip_dll_struct*                 laszip_dll
)
{
  if ((laszip_dll->header.version_major != 1) || (laszip_dll->header.version_minor > 4))
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "unknown LAS version %d.%d", (I32)laszip_dll->header.version_major, (I32)laszip_dll->header.version_minor);
    return 1;
  }

  // check counters
  U32 i;

  if (laszip_dll->header.point_data_format > 5)
  {
    // legacy counters are zero for new point types

    laszip_dll->header.number_of_point_records = 0;
    for (i = 0; i < 5; i++)
    {
      laszip_dll->header.number_of_points_by_return[i] = 0;
    }
  }
  else if (laszip_dll->header.version_minor > 3)
  {
    // legacy counters must be zero or consistent for old point types

    if (laszip_dll->header.number_of_point_records != laszip_dll->header.extended_number_of_point_records)
    {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wformat"
#endif
      if (laszip_dll->header.number_of_point_records != 0)
      {
        snprintf(laszip_dll->error, sizeof(laszip_dll->error), "inconsistent number_of_point_records %lu and extended_number_of_point_records %llu", laszip_dll->header.number_of_point_records, laszip_dll->header.extended_number_of_point_records);
        return 1;
      }     
      else if (laszip_dll->header.extended_number_of_point_records <= U32_MAX)
      {
        laszip_dll->header.number_of_point_records = (U32)laszip_dll->header.extended_number_of_point_records;
      }
    }
    for (i = 0; i < 5; i++)
    {
      if (laszip_dll->header.number_of_points_by_return[i] != laszip_dll->header.extended_number_of_points_by_return[i])
      {
        if (laszip_dll->header.number_of_points_by_return[i] != 0)
        {
          snprintf(laszip_dll->error, sizeof(laszip_dll->error), "inconsistent number_of_points_by_return[%u] %lu and extended_number_of_points_by_return[%u] %llu", i, laszip_dll->header.number_of_points_by_return[i], i, laszip_dll->header.extended_number_of_points_by_return[i]);
          return 1;
        }   
        else if (laszip_dll->header.extended_number_of_points_by_return[i] <= U32_MAX)
        {
          laszip_dll->header.number_of_points_by_return[i] = (U32)laszip_dll->header.extended_number_of_points_by_return[i];
        }
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
      }
    }
  }

  return 0;
}